

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::detail::SerializeAttribute<int>
               (string *attr_name,TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *attr,
               string *value_str,string *err)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar4;
  int value;
  ostringstream ss_e;
  stringstream value_ss;
  string local_370;
  string local_350;
  string local_330 [3];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start) || ((attr->_empty & 1U) == 0)) {
    if (attr->_blocked == true) {
      ::std::__cxx11::string::_M_replace
                ((ulong)value_str,0,(char *)value_str->_M_string_length,0x41f4cd);
LAB_002e70ad:
      bVar4 = true;
      goto LAB_002e70af;
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x228;
    lVar3 = 600;
    if ((attr->_attrib).has_value_ != false) {
      lVar3 = 0x228;
    }
    if (*(char *)((long)&(attr->_metas).interpolation.contained + lVar3) != '\x01') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<(local_330,0x1b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"Failed to get the value of `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_370,(fmt *)&local_350,(string *)attr_name,args);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_330,
                          (char *)CONCAT44(local_370._M_dataplus._M_p._4_4_,
                                           local_370._M_dataplus._M_p._0_4_),
                          local_370._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
          &local_370.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_),
                        local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) goto LAB_002e7020;
      goto LAB_002e702d;
    }
    cVar1 = *(char *)((long)&(attr->_metas).interpolation.contained + lVar3 + 1);
    if (cVar1 == '\0') {
      local_370._M_dataplus._M_p._0_4_ =
           *(undefined4 *)(&(attr->_metas).interpolation.has_value_ + lVar3);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
      to_xml_string<int>(local_330,(int *)&local_370);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
        operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<(local_330,0x1b3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"Failed to get the value at default time of `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_370,(fmt *)&local_350,(string *)attr_name,args);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_330,
                          (char *)CONCAT44(local_370._M_dataplus._M_p._4_4_,
                                           local_370._M_dataplus._M_p._0_4_),
                          local_370._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
          &local_370.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_),
                        local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
            &local_370.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_
                                  ),local_370.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      ::std::ios_base::~ios_base(local_2c0);
    }
    if (cVar1 == '\0') {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)value_str,(string *)local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
        operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_002e70ad;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"SerializeAttribute",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_330,0x1a6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,"TODO: connection attribute","");
    fmt::format(&local_370,&local_350);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_330,
                        (char *)CONCAT44(local_370._M_dataplus._M_p._4_4_,
                                         local_370._M_dataplus._M_p._0_4_),
                        local_370._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
        &local_370.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_),
                      local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
LAB_002e7020:
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
LAB_002e702d:
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append
                ((char *)err,
                 CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
          &local_370.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_),
                        local_370.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
    ::std::ios_base::~ios_base(local_2c0);
  }
  bVar4 = false;
LAB_002e70af:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar4;
}

Assistant:

bool SerializeAttribute(const std::string &attr_name,
                        const TypedAttributeWithFallback<Animatable<T>> &attr,
                        std::string &value_str, std::string *err) {
  std::stringstream value_ss;

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: connection attribute"));
  } else if (attr.is_blocked()) {
    // do nothing
    value_str = "";
    return true;
  } else {
    const Animatable<T> &animatable_value = attr.get_value();
    if (animatable_value.has_default()) {
      T value;
      if (animatable_value.get_scalar(&value)) {
        value_ss << "\"" << to_xml_string(value) << "\"";
      } else {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Failed to get the value at default time of `{}`", attr_name));
      }
    } else { 
      // no time-varying(timesamples) attribute in MaterialX.
      
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to get the value of `{}`", attr_name));
    }
  }

  value_str = value_ss.str();
  return true;
}